

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O1

void __thiscall cfd::core::Block::Block(Block *this,Block *object)

{
  uint32_t uVar1;
  
  this->_vptr_Block = (_func_int **)&PTR__Block_0088b1f0;
  ByteData::ByteData(&this->data_);
  (this->header_).version = 0;
  (this->header_).prev_block_hash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_0087ccf8;
  ByteData::ByteData(&(this->header_).prev_block_hash.data_);
  (this->header_).merkle_root_hash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_0087ccf8;
  ByteData::ByteData(&(this->header_).merkle_root_hash.data_);
  (this->header_).time = 0;
  (this->header_).bits = 0;
  (this->header_).nonce = 0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txs_).super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->txids_).super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteData::operator=(&this->data_,&object->data_);
  (this->header_).version = (object->header_).version;
  BlockHash::operator=(&(this->header_).prev_block_hash,&(object->header_).prev_block_hash);
  BlockHash::operator=(&(this->header_).merkle_root_hash,&(object->header_).merkle_root_hash);
  (this->header_).nonce = (object->header_).nonce;
  uVar1 = (object->header_).bits;
  (this->header_).time = (object->header_).time;
  (this->header_).bits = uVar1;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&this->txs_,&object->txs_);
  ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::operator=
            (&this->txids_,&object->txids_);
  return;
}

Assistant:

Block::Block(const Block& object) {
  data_ = object.data_;
  header_ = object.header_;
  txs_ = object.txs_;
  txids_ = object.txids_;
}